

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O1

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,
          map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_> *m1
          ,map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
           *m2)

{
  pointer pwVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  wstring *this_00;
  _Self __tmp;
  _Rb_tree_header *p_Var4;
  _Self __tmp_1;
  bool bVar5;
  
  p_Var2 = (m1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = (m2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(m1->_M_t)._M_impl.super__Rb_tree_header;
  bVar5 = (_Rb_tree_header *)p_Var2 == p_Var4;
  if (!bVar5) {
    do {
      if ((_Rb_tree_header *)p_Var3 == &(m2->_M_t)._M_impl.super__Rb_tree_header) {
        if (!bVar5) {
          freopen((char *)0x0,"w",_stdout);
          wprintf(L"%ls FAIL\nExpected: (%lc, %d)\nActual: none",(strCase->_M_dataplus)._M_p,
                  (ulong)p_Var2[1]._M_color,(ulong)*(uint *)&p_Var2[1].field_0x4);
          wprintf(L"\n");
          this_00 = (wstring *)__cxa_allocate_exception(0x20);
          std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
          goto LAB_00156adc;
        }
        break;
      }
      if ((p_Var2[1]._M_color != p_Var3[1]._M_color) ||
         (*(int *)&p_Var2[1].field_0x4 != *(int *)&p_Var3[1].field_0x4)) {
        freopen((char *)0x0,"w",_stdout);
        wprintf(L"%ls FAIL\nExpected: (%lc, %d)\nActual: (%lc, %d)",(strCase->_M_dataplus)._M_p,
                (ulong)p_Var2[1]._M_color,(ulong)*(uint *)&p_Var2[1].field_0x4,
                (ulong)p_Var3[1]._M_color,(ulong)*(uint *)&p_Var3[1].field_0x4);
        wprintf(L"\n");
        this_00 = (wstring *)__cxa_allocate_exception(0x20);
        std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
        goto LAB_00156adc;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar5 = (_Rb_tree_header *)p_Var2 == p_Var4;
    } while (!bVar5);
  }
  freopen((char *)0x0,"w",_stdout);
  pwVar1 = (strCase->_M_dataplus)._M_p;
  if ((_Rb_tree_header *)p_Var3 == &(m2->_M_t)._M_impl.super__Rb_tree_header) {
    wprintf(L"%ls OK",pwVar1);
    wprintf(L"\n");
    return;
  }
  wprintf(L"%ls FAIL\nExpected: none\nActual: (%lc, %d)",pwVar1,(ulong)p_Var3[1]._M_color,
          (ulong)*(uint *)&p_Var3[1].field_0x4);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
LAB_00156adc:
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::map<wchar_t, int> &m1, const std::map<wchar_t, int> &m2) {
  auto i1 = m1.begin();
  auto i2 = m2.begin();

  while (i1 != m1.end() && i2 != m2.end()) {
    if (i1->first != i2->first || i1->second != i2->second) {
      dmpDebug(L"%ls FAIL\nExpected: (%lc, %d)\nActual: (%lc, %d)", dmpPrintable(strCase),
          i1->first, i1->second, i2->first, i2->second);
      throw strCase;
    }
    i1++;
    i2++;
  }

  if (i1 != m1.end()) {
    dmpDebug(L"%ls FAIL\nExpected: (%lc, %d)\nActual: none",
        dmpPrintable(strCase), i1->first, i1->second);
    throw strCase;
  }
  if (i2 != m2.end()) {
    dmpDebug(L"%ls FAIL\nExpected: none\nActual: (%lc, %d)",
        dmpPrintable(strCase), i2->first, i2->second);
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}